

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

int __thiscall Matrix::remove(Matrix *this,char *__filename)

{
  int iVar1;
  Physical *pPVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ulong uVar7;
  int *piVar8;
  reference pvVar9;
  void *pvVar10;
  void *pvVar11;
  Physical *this_00;
  long lVar12;
  int local_50;
  int local_4c;
  int k;
  int r;
  int iStack_40;
  bool copyData;
  int i_2;
  int n;
  int i_1;
  int *index;
  double *newData;
  int i;
  int newSize;
  int *newShape;
  vector<int,_std::allocator<int>_> *removal_local;
  Matrix *this_local;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->nMatrixDimension;
  uVar7 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar7);
  newData._4_4_ = 1;
  for (newData._0_4_ = 0; (int)newData < this->nMatrixDimension; newData._0_4_ = (int)newData + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)__filename,(long)(int)newData);
    if ((*pvVar9 < 0) || (this->pSize[(int)newData] < 2)) {
      piVar8[(int)newData] = this->pSize[(int)newData];
    }
    else {
      piVar8[(int)newData] = this->pSize[(int)newData] + -1;
    }
    newData._4_4_ = piVar8[(int)newData] * newData._4_4_;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)newData._4_4_;
  uVar7 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar7);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)this->nMatrixDimension;
  uVar7 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar7);
  for (i_2 = 0; i_2 < this->nMatrixDimension; i_2 = i_2 + 1) {
    *(undefined4 *)((long)pvVar11 + (long)i_2 * 4) = 0;
  }
  iStack_40 = 0;
  r = 0;
  do {
    if (this->nData <= r) {
      if (this->pMult != (int *)0x0) {
        operator_delete__(this->pMult);
      }
      pPVar2 = this->pPhysicals;
      if (pPVar2 != (Physical *)0x0) {
        lVar12 = *(long *)&pPVar2[-1].physicalUnit.nExpPrefix;
        this_00 = pPVar2 + lVar12;
        while (pPVar2 != this_00) {
          this_00 = this_00 + -1;
          Physical::~Physical(this_00);
        }
        operator_delete__(&pPVar2[-1].physicalUnit.nExpPrefix,lVar12 * 0x98 + 8);
      }
      if (this->pSize != (int *)0x0) {
        operator_delete__(this->pSize);
      }
      this->pSize = piVar8;
      init(this,(EVP_PKEY_CTX *)0x1);
      return (int)this;
    }
    bVar6 = true;
    for (local_4c = 0; local_4c < this->nMatrixDimension; local_4c = local_4c + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)__filename,(long)local_4c);
      if ((*pvVar9 != -1) &&
         (iVar1 = *(int *)((long)pvVar11 + (long)local_4c * 4),
         pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)__filename,(long)local_4c),
         iVar1 == *pvVar9)) {
        bVar6 = false;
        break;
      }
    }
    if (bVar6) {
      *(double *)((long)pvVar10 + (long)iStack_40 * 8) = this->pData[r];
      iStack_40 = iStack_40 + 1;
    }
    lVar12 = (long)(this->nMatrixDimension + -1);
    *(int *)((long)pvVar11 + lVar12 * 4) = *(int *)((long)pvVar11 + lVar12 * 4) + 1;
    local_50 = this->nMatrixDimension;
    while (iVar1 = local_50, local_50 = iVar1 + -1, local_50 != 0) {
      if (this->pSize[local_50] <= *(int *)((long)pvVar11 + (long)local_50 * 4)) {
        *(undefined4 *)((long)pvVar11 + (long)local_50 * 4) = 0;
        lVar12 = (long)(iVar1 + -2);
        *(int *)((long)pvVar11 + lVar12 * 4) = *(int *)((long)pvVar11 + lVar12 * 4) + 1;
      }
    }
    r = r + 1;
  } while( true );
}

Assistant:

Matrix &Matrix::remove(vector<int> removal)
{
	// create new data store and new shape vector
	int *newShape = new int[nMatrixDimension];
	int newSize = 1;
	for (int i=0; i<nMatrixDimension; ++i) {
		if (removal[i] >= 0 && pSize[i]>1)
			newShape[i] = pSize[i]-1;
		else
			newShape[i] = pSize[i];
		newSize *= newShape[i];
	}
	double *newData = new double[newSize];
	
	// vector with current index coordinates
	int *index = new int[nMatrixDimension];
	for (int i=0; i<nMatrixDimension; ++i)
		index[i] = 0;
	
	// copy each data point
	int n=0; // single index into new data
	for (int i=0; i<nData; ++i) {
		
		// compare index vector to removal vector
		bool copyData = true;
		for (int r=0; r<nMatrixDimension; ++r)
			if (removal[r] != -1 && index[r] == removal[r]) {
				copyData = false;
				break;
			}
		
		// copy if index does not match removal vector
		if (copyData)
			newData[n++] = pData[i];
		
		// increment  index vector
		index[nMatrixDimension-1]++;
		for (int k=nMatrixDimension-1; k; --k)
			if (index[k] >= pSize[k]) {
				index[k] = 0;
				index[k-1]++;
			}		
	}
	
	// assign new data
	delete[] pMult;
	delete[] pPhysicals;
	delete[] pSize;
	pSize = newShape;
	init();
	
	return *this;
}